

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_tools.h
# Opt level: O2

Ptr __thiscall core::image::blur_gaussian<float>(image *this,ConstPtr *in,float sigma)

{
  int width;
  int height;
  element_type *peVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  invalid_argument *this_00;
  int i_1;
  int y;
  int iVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int x;
  int iVar12;
  int cc;
  int iVar13;
  int i;
  uint uVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  Ptr PVar18;
  undefined1 local_90 [8];
  vector<float,_std::allocator<float>_> kernel;
  float local_70;
  int local_6c;
  float sigma_local;
  undefined4 uStack_64;
  Ptr sep;
  Ptr *out;
  int local_34;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  
  peVar1 = (in->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_70 = sigma;
  if (peVar1 != (element_type *)0x0) {
    if (ABS(sigma) <= 0.1) {
      PVar18 = Image<float>::duplicate((Image<float> *)this);
      _Var7 = PVar18.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    }
    else {
      width = (peVar1->super_TypedImageBase<float>).super_ImageBase.w;
      height = (peVar1->super_TypedImageBase<float>).super_ImageBase.h;
      iVar6 = (peVar1->super_TypedImageBase<float>).super_ImageBase.c;
      fVar16 = ceilf(sigma * 2.884);
      iVar15 = (int)fVar16;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)local_90,(long)(iVar15 + 1),
                 (allocator_type *)&sigma_local);
      sep.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)iVar15;
      for (lVar9 = 0;
          lVar9 <= (long)sep.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi; lVar9 = lVar9 + 1) {
        sigma_local = (float)(int)lVar9;
        fVar16 = math::gaussian<float>(&sigma_local,&local_70);
        *(float *)((long)local_90 + lVar9 * 4) = fVar16;
      }
      Image<float>::create((Image<float> *)&sigma_local,width,height,iVar6);
      iVar10 = 0;
      if (0 < iVar6) {
        iVar10 = iVar6;
      }
      sep.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = iVar10;
      iVar3 = 0;
      if (0 < width) {
        iVar3 = width;
      }
      iVar4 = 0;
      if (0 < height) {
        iVar4 = height;
      }
      local_34 = 0;
      iVar12 = 0;
      while (iVar11 = iVar12, iVar11 != iVar4) {
        for (iVar12 = 0; iVar12 != iVar3; iVar12 = iVar12 + 1) {
          kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)CONCAT44(uStack_64,sigma_local);
          for (iVar13 = 0; iVar13 != iVar10; iVar13 = iVar13 + 1) {
            fVar16 = 0.0;
            fVar17 = 0.0;
            for (uVar14 = -iVar15; (int)uVar14 <= iVar15; uVar14 = uVar14 + 1) {
              iVar8 = iVar12 + uVar14;
              iVar5 = width + -1;
              if (iVar8 < width + -1) {
                iVar5 = iVar8;
              }
              if (iVar8 < 0) {
                iVar5 = 0;
              }
              peVar1 = (in->super___shared_ptr<const_core::Image<float>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              uVar2 = -uVar14;
              if (0 < (int)uVar14) {
                uVar2 = uVar14;
              }
              fVar16 = fVar16 + (peVar1->super_TypedImageBase<float>).data.
                                super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start
                                [(iVar5 + iVar11 * width) *
                                 (peVar1->super_TypedImageBase<float>).super_ImageBase.c + iVar13] *
                                *(float *)((long)local_90 + (ulong)uVar2 * 4);
              fVar17 = fVar17 + *(float *)((long)local_90 + (ulong)uVar2 * 4);
            }
            *(float *)(*(long *)(kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage + 6) +
                      (long)((int)kernel.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage[4] * local_34 + iVar13)
                      * 4) = fVar16 / fVar17;
          }
          local_34 = local_34 + 1;
        }
        local_6c = iVar11;
        iVar12 = iVar11 + 1;
      }
      Image<float>::create((Image<float> *)this,width,height,iVar6);
      local_34 = 0;
      for (iVar6 = 0; iVar6 != iVar4; iVar6 = iVar6 + 1) {
        for (iVar10 = 0; iVar10 != iVar3; iVar10 = iVar10 + 1) {
          lVar9 = *(long *)this;
          for (iVar12 = 0;
              iVar12 != (int)sep.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi; iVar12 = iVar12 + 1) {
            fVar16 = 0.0;
            fVar17 = 0.0;
            for (uVar14 = -iVar15; (int)uVar14 <= iVar15; uVar14 = uVar14 + 1) {
              iVar11 = iVar6 + uVar14;
              iVar13 = height + -1;
              if (iVar11 < height + -1) {
                iVar13 = iVar11;
              }
              if (iVar11 < 0) {
                iVar13 = 0;
              }
              uVar2 = -uVar14;
              if (0 < (int)uVar14) {
                uVar2 = uVar14;
              }
              fVar16 = fVar16 + *(float *)(*(long *)(CONCAT44(uStack_64,sigma_local) + 0x18) +
                                          (long)((iVar13 * width + iVar10) *
                                                 *(int *)(CONCAT44(uStack_64,sigma_local) + 0x10) +
                                                iVar12) * 4) *
                                *(float *)((long)local_90 + (ulong)uVar2 * 4);
              fVar17 = fVar17 + *(float *)((long)local_90 + (ulong)uVar2 * 4);
            }
            *(float *)(*(long *)(lVar9 + 0x18) +
                      (long)(*(int *)(lVar9 + 0x10) * local_34 + iVar12) * 4) = fVar16 / fVar17;
          }
          local_34 = local_34 + 1;
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sep);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)local_90);
      _Var7._M_pi = extraout_RDX;
    }
    PVar18.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var7._M_pi;
    PVar18.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar18.super___shared_ptr<core::Image<float>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Null image given");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

typename Image<T>::Ptr
blur_gaussian (typename Image<T>::ConstPtr in, float sigma)
{
    if (in == nullptr)
        throw std::invalid_argument("Null image given");

    /* Small sigmas result in literally no change. */
    if (MATH_EPSILON_EQ(sigma, 0.0f, 0.1f))
        return in->duplicate();

    int const w = in->width();
    int const h = in->height();
    int const c = in->channels();
    int const ks = std::ceil(sigma * 2.884f); // Cap kernel at 1/128
    std::vector<float> kernel(ks + 1);

    /* Fill kernel values. */
    for (int i = 0; i < ks + 1; ++i)
        kernel[i] = math::gaussian((float)i, sigma);

#if 1 // Separated kernel implementation

    /* Convolve the image in x direction. */
    typename Image<T>::Ptr sep(Image<T>::create(w, h, c));
    int px = 0;
    for (int y = 0; y < h; ++y)
        for (int x = 0; x < w; ++x, ++px)
            for (int cc = 0; cc < (int)c; ++cc)
            {
                math::Accum<T> accum(T(0));
                for (int i = -ks; i <= ks; ++i)
                {
                    int idx = math::clamp(x + i, 0, (int)w - 1);
                    accum.add(in->at(y * w + idx, cc), kernel[std::abs(i)]);
                }
                sep->at(px, cc) = accum.normalized();
            }

    /* Convolve the image in y direction. */
    typename Image<T>::Ptr out(Image<T>::create(w, h, c));
    px = 0;
    for (int y = 0; y < h; ++y)
        for (int x = 0; x < w; ++x, ++px)
            for (int cc = 0; cc < c; ++cc)
            {
                math::Accum<T> accum(T(0));
                for (int i = -ks; i <= ks; ++i)
                {
                    int idx = math::clamp(y + i, 0, (int)h - 1);
                    accum.add(sep->at(idx * w + x, cc), kernel[std::abs(i)]);
                }
                out->at(px, cc) = accum.normalized();
            }

#else // Non-separated kernel implementation

    typename Image<T>::Ptr out(Image<T>::create(w, h, c));
    int px = 0;
    for (int y = 0; y < h; ++y)
        for (int x = 0; x < w; ++x, ++px)
            for (int cc = 0; cc < c; ++cc)
            {
                math::Accum<T> accum(T(0));

                for (int ky = -ks; ky <= ks; ++ky)
                    for (int kx = -ks; kx <= ks; ++kx)
                    {
                        int idx_x = math::clamp(x + kx, 0, (int)w - 1);
                        int idx_y = math::clamp(y + ky, 0, (int)h - 1);
                        accum.add(in->at(idx_y * w + idx_x, cc),
                            kernel[std::abs(kx)] * kernel[std::abs(ky)]);
                    }

                out->at(px, cc) = accum.normalized();
            }

#endif

    return out;
}